

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O0

ByteString * OSSL::oid2ByteString(int nid)

{
  int iVar1;
  ASN1_PRINTABLESTRING *str_00;
  void *data;
  int in_ESI;
  ByteString *in_RDI;
  uchar *p;
  ASN1_PRINTABLESTRING *str;
  string name;
  ByteString *rv;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uchar *local_50;
  ASN1_PRINTABLESTRING *local_48;
  undefined4 local_40;
  string local_30 [35];
  byte local_d;
  int local_c;
  
  local_d = 0;
  local_c = in_ESI;
  ByteString::ByteString((ByteString *)0x1c41c0);
  std::__cxx11::string::string(local_30);
  if (local_c == 0x40a) {
    std::__cxx11::string::operator=(local_30,"curve25519");
  }
  else if (local_c == 0x40b) {
    std::__cxx11::string::operator=(local_30,"curve448");
  }
  else if (local_c == 0x43f) {
    std::__cxx11::string::operator=(local_30,"edwards25519");
  }
  else {
    if (local_c != 0x440) goto LAB_001c435b;
    std::__cxx11::string::operator=(local_30,"edwards448");
  }
  str_00 = ASN1_PRINTABLESTRING_new();
  local_48 = str_00;
  data = (void *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::length();
  ASN1_STRING_set(str_00,data,iVar1);
  iVar1 = i2d_ASN1_PRINTABLESTRING(local_48,(uchar **)0x0);
  ByteString::resize((ByteString *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
  local_50 = ByteString::operator[]
                       ((ByteString *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
  i2d_ASN1_PRINTABLESTRING(local_48,&local_50);
  ASN1_PRINTABLESTRING_free(local_48);
LAB_001c435b:
  local_d = 1;
  local_40 = 1;
  std::__cxx11::string::~string(local_30);
  if ((local_d & 1) == 0) {
    ByteString::~ByteString((ByteString *)0x1c4379);
  }
  return in_RDI;
}

Assistant:

ByteString OSSL::oid2ByteString(int nid)
{
	ByteString rv;
	std::string name;

	switch (nid)
	{
		case EVP_PKEY_ED25519:
			name = "edwards25519";
			break;

		case EVP_PKEY_X25519:
			name = "curve25519";
			break;

		case EVP_PKEY_ED448:
			name = "edwards448";
			break;

		case EVP_PKEY_X448:
			name = "curve448";
			break;

		default:
			return rv;
	}

	ASN1_PRINTABLESTRING *str = ASN1_PRINTABLESTRING_new();
	ASN1_STRING_set(str, name.c_str(), name.length());
	rv.resize(i2d_ASN1_PRINTABLESTRING(str, NULL));
	unsigned char *p = &rv[0];
	i2d_ASN1_PRINTABLESTRING(str, &p);
	ASN1_PRINTABLESTRING_free(str);

	return rv;
}